

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::GLSLConstantIntegralExpressionTest::prepareUniforms
          (GLSLConstantIntegralExpressionTest *this,GLuint param_1,ProgramInterface *param_2,
          Program *program,Buffer *param_4)

{
  Buffer *pBVar1;
  int iVar2;
  GLint GVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  allocator<char> local_c1;
  string local_c0;
  GLint local_a0;
  allocator<char> local_99;
  GLint goten_location;
  GLint local_78;
  GLint gohan_location;
  allocator<char> local_61;
  string local_60;
  GLint local_3c;
  Functions *pFStack_38;
  GLint goku_location;
  Functions *gl;
  Buffer *param_5_local;
  Program *program_local;
  ProgramInterface *param_3_local;
  GLSLConstantIntegralExpressionTest *pGStack_10;
  GLuint param_2_local;
  GLSLConstantIntegralExpressionTest *this_local;
  
  gl = (Functions *)param_4;
  param_5_local = (Buffer *)program;
  program_local = (Program *)param_2;
  param_3_local._4_4_ = param_1;
  pGStack_10 = this;
  pRVar4 = deqp::Context::getRenderContext
                     ((this->super_TextureTestBase).super_TestBase.super_TestCase.m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  pBVar1 = param_5_local;
  pFStack_38 = (Functions *)CONCAT44(extraout_var,iVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"goku",&local_61);
  GVar3 = Utils::Program::GetUniformLocation((Program *)pBVar1,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  pBVar1 = param_5_local;
  local_3c = GVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&goten_location,"gohan",&local_99);
  GVar3 = Utils::Program::GetUniformLocation((Program *)pBVar1,(string *)&goten_location);
  std::__cxx11::string::~string((string *)&goten_location);
  std::allocator<char>::~allocator(&local_99);
  pBVar1 = param_5_local;
  local_78 = GVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"goten",&local_c1);
  GVar3 = Utils::Program::GetUniformLocation((Program *)pBVar1,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  local_a0 = GVar3;
  Utils::Program::Uniform
            (pFStack_38,(Type *)&Utils::Type::uint,1,local_3c,prepareUniforms::uniform_data);
  Utils::Program::Uniform
            (pFStack_38,(Type *)&Utils::Type::uint,this->m_gohan_length,local_78,
             prepareUniforms::uniform_data);
  Utils::Program::Uniform
            (pFStack_38,(Type *)&Utils::Type::uint,this->m_goten_length,local_a0,
             prepareUniforms::uniform_data);
  return;
}

Assistant:

void GLSLConstantIntegralExpressionTest::prepareUniforms(GLuint /* test_case_index */,
														 Utils::ProgramInterface& /* program_interface */,
														 Utils::Program& program, Utils::Buffer& /* cs_buffer */)
{
	static const GLuint uniform_data[16] = { 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1 };

	const Functions& gl = m_context.getRenderContext().getFunctions();

	GLint goku_location  = program.GetUniformLocation("goku");
	GLint gohan_location = program.GetUniformLocation("gohan");
	GLint goten_location = program.GetUniformLocation("goten");

	program.Uniform(gl, Utils::Type::uint, 1 /* count */, goku_location, uniform_data);
	program.Uniform(gl, Utils::Type::uint, m_gohan_length, gohan_location, uniform_data);
	program.Uniform(gl, Utils::Type::uint, m_goten_length, goten_location, uniform_data);
}